

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QCss::BasicSelector>::moveAppend
          (QGenericArrayOps<QCss::BasicSelector> *this,BasicSelector *b,BasicSelector *e)

{
  qsizetype *pqVar1;
  BasicSelector *pBVar2;
  long lVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  qsizetype qVar6;
  Data *pDVar7;
  QString *pQVar8;
  Data *pDVar9;
  Pseudo *pPVar10;
  Data *pDVar11;
  AttributeSelector *pAVar12;
  
  if ((b != e) && (b < e)) {
    pBVar2 = (this->super_QArrayDataPointer<QCss::BasicSelector>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<QCss::BasicSelector>).size;
      pDVar4 = (b->elementName).d.d;
      (b->elementName).d.d = (Data *)0x0;
      pBVar2[lVar3].elementName.d.d = pDVar4;
      pcVar5 = (b->elementName).d.ptr;
      (b->elementName).d.ptr = (char16_t *)0x0;
      pBVar2[lVar3].elementName.d.ptr = pcVar5;
      qVar6 = (b->elementName).d.size;
      (b->elementName).d.size = 0;
      pBVar2[lVar3].elementName.d.size = qVar6;
      pDVar7 = (b->ids).d.d;
      (b->ids).d.d = (Data *)0x0;
      pBVar2[lVar3].ids.d.d = pDVar7;
      pQVar8 = (b->ids).d.ptr;
      (b->ids).d.ptr = (QString *)0x0;
      pBVar2[lVar3].ids.d.ptr = pQVar8;
      qVar6 = (b->ids).d.size;
      (b->ids).d.size = 0;
      pBVar2[lVar3].ids.d.size = qVar6;
      pDVar9 = (b->pseudos).d.d;
      (b->pseudos).d.d = (Data *)0x0;
      pBVar2[lVar3].pseudos.d.d = pDVar9;
      pPVar10 = (b->pseudos).d.ptr;
      (b->pseudos).d.ptr = (Pseudo *)0x0;
      pBVar2[lVar3].pseudos.d.ptr = pPVar10;
      qVar6 = (b->pseudos).d.size;
      (b->pseudos).d.size = 0;
      pBVar2[lVar3].pseudos.d.size = qVar6;
      pDVar11 = (b->attributeSelectors).d.d;
      (b->attributeSelectors).d.d = (Data *)0x0;
      pBVar2[lVar3].attributeSelectors.d.d = pDVar11;
      pAVar12 = (b->attributeSelectors).d.ptr;
      (b->attributeSelectors).d.ptr = (AttributeSelector *)0x0;
      pBVar2[lVar3].attributeSelectors.d.ptr = pAVar12;
      qVar6 = (b->attributeSelectors).d.size;
      (b->attributeSelectors).d.size = 0;
      pBVar2[lVar3].attributeSelectors.d.size = qVar6;
      pBVar2[lVar3].relationToNext = b->relationToNext;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<QCss::BasicSelector>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }